

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case.c
# Opt level: O2

int XUtf8Toupper(int ucs)

{
  int iVar1;
  unsigned_short *puVar2;
  long lVar3;
  int ucs_00;
  
  puVar2 = XUtf8Toupper::table;
  if (XUtf8Toupper::table == (unsigned_short *)0x0) {
    puVar2 = (unsigned_short *)malloc(0x20000);
    XUtf8Toupper::table = puVar2;
    for (lVar3 = 0; lVar3 != 0x10000; lVar3 = lVar3 + 1) {
      puVar2[lVar3] = (unsigned_short)lVar3;
    }
    for (ucs_00 = 0; ucs_00 != 0x10000; ucs_00 = ucs_00 + 1) {
      iVar1 = XUtf8Tolower(ucs_00);
      if (ucs_00 != iVar1) {
        puVar2[iVar1] = (unsigned_short)ucs_00;
      }
    }
  }
  if ((uint)ucs < 0x10000) {
    ucs = (int)puVar2[(uint)ucs];
  }
  return ucs;
}

Assistant:

int 
XUtf8Toupper(int ucs) {
  int i;
  static unsigned short *table = NULL;

  if (!table) {
    table = (unsigned short*) malloc(sizeof(unsigned short) * 0x10000);
    for (i = 0; i < 0x10000; i++) {
      table[i] = (unsigned short) i;
    }
    for (i = 0; i < 0x10000; i++) {
      int l;
      l = XUtf8Tolower(i);
      if (l != i) table[l] = (unsigned short) i;
    }
  }
  if (ucs >= 0x10000 || ucs < 0) return ucs;
  return table[ucs];
}